

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O0

void __thiscall
supermap::
KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long,_void>::
KeyValueShrinkableStorage
          (KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long,_void>
           *this,KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long,_void>
                 *oldStorage,KeyIndexStorage *actualIndex,string *notSortedStorageFilename,
          string *sortedStorageFilename,size_t indexBatchSize)

{
  bool bVar1;
  string_type *__source;
  CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  *pCVar2;
  unsigned_long uVar3;
  iterator this_00;
  shared_ptr<supermap::io::FileManager> *in_RDI;
  vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
  currentBatchIndex;
  OutputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>
  keyValueOutputIterator;
  InputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_10UL,_void>
  indexIterator;
  KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long,_void>
  *in_stack_fffffffffffffd98;
  path *in_stack_fffffffffffffda0;
  undefined1 *collectionSizeLimit;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  *in_stack_fffffffffffffda8;
  InputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_10UL,_void>
  *this_01;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void,_supermap::Key<2UL>_>
  *in_stack_fffffffffffffdb0;
  OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  *this_02;
  path *ppVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_03;
  undefined8 in_stack_fffffffffffffdf0;
  format fVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source_00;
  path *in_stack_fffffffffffffe00;
  path *this_04;
  InnerRegisterSupplier *registerSupplier;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  *in_stack_fffffffffffffe20;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>
  *in_stack_fffffffffffffe28;
  anon_class_8_1_9d0d8c12 in_stack_fffffffffffffe50;
  __normal_iterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_*,_std::vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>_>
  in_stack_fffffffffffffe58;
  __normal_iterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_*,_std::vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>_>
  in_stack_fffffffffffffe60;
  path local_198;
  undefined1 local_150 [144];
  undefined1 local_c0 [112];
  path local_50 [2];
  
  fVar5 = (format)((ulong)in_stack_fffffffffffffdf0 >> 0x38);
  ppVar4 = local_50;
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,void>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,void>>>()>
  ::
  function<supermap::KeyValueShrinkableStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long,void>::KeyValueShrinkableStorage(supermap::KeyValueShrinkableStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long,void>const&,supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,void,supermap::Key<2ul>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_long)::_lambda()_1_,void>
            ((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
              *)in_stack_fffffffffffffdb0,(anon_class_1_0_00000001 *)in_stack_fffffffffffffda8);
  IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  ::OrderedStorage((IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
                    *)in_stack_fffffffffffffda0,(InnerRegisterSupplier *)in_stack_fffffffffffffd98);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
               *)0x1e72b2);
  (in_RDI->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR_append_0038d238;
  registerSupplier = (InnerRegisterSupplier *)(in_RDI + 2);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,fVar5);
  __source_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_c0 + 0x20);
  getFileManager(in_stack_fffffffffffffd98);
  this_04 = (path *)local_c0;
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,void>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,void>>>()>
  ::
  function<supermap::KeyValueShrinkableStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long,void>::KeyValueShrinkableStorage(supermap::KeyValueShrinkableStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long,void>const&,supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,void,supermap::Key<2ul>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_long)::_lambda()_2_,void>
            ((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
              *)in_stack_fffffffffffffdb0,(anon_class_1_0_00000001 *)in_stack_fffffffffffffda8);
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void,_supermap::Key<2UL>_>
  ::SingleFileIndexedStorage
            (in_stack_fffffffffffffdb0,(path *)in_stack_fffffffffffffda8,
             (shared_ptr<supermap::io::FileManager> *)in_stack_fffffffffffffda0,
             (InnerRegisterSupplier *)in_stack_fffffffffffffd98);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
               *)0x1e7345);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x1e7352);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffda0);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (this_04,__source_00,
             (format)((ulong)&in_RDI[5].
                              super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount >> 0x38));
  getFileManager(in_stack_fffffffffffffd98);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,void>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,void>>>()>
  ::
  function<supermap::KeyValueShrinkableStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long,void>::KeyValueShrinkableStorage(supermap::KeyValueShrinkableStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long,void>const&,supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,void,supermap::Key<2ul>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_long)::_lambda()_3_,void>
            ((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
              *)in_stack_fffffffffffffdb0,(anon_class_1_0_00000001 *)in_stack_fffffffffffffda8);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  ::SingleFileIndexedStorage(in_stack_fffffffffffffe20,ppVar4,in_RDI,registerSupplier);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
               *)0x1e73e8);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x1e73f5);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffda0);
  this_03 = &in_RDI[8].super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>_>_>_()>
  ::function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>_>_>_()>
              *)in_stack_fffffffffffffdb0,
             (function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>_>_>_()>
              *)in_stack_fffffffffffffda8);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>
  ::getDataIterator(in_stack_fffffffffffffe28);
  fVar5 = (format)((ulong)local_150 >> 0x38);
  getFileManager(in_stack_fffffffffffffd98);
  __source = (string_type *)
             std::
             __shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e7461);
  ppVar4 = &local_198;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,unsigned_long,void>
  ::getStorageFilePath_abi_cxx11_(in_stack_fffffffffffffda8);
  std::filesystem::__cxx11::path::path(ppVar4,__source,fVar5);
  io::FileManager::
  getOutputIterator<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>>
            ((FileManager *)this_03,ppVar4,SUB81((ulong)__source >> 0x38,0));
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffda0);
  std::__cxx11::string::~string((string *)&local_198);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x1e74df);
  io::
  InputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_10UL,_void>::
  collect((InputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_10UL,_void>
           *)in_stack_fffffffffffffda8,(unsigned_long)in_stack_fffffffffffffda0);
  this_02 = (OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
             *)(in_RDI + 2);
  pCVar2 = OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
           ::getRegister(this_02);
  uVar3 = OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
          ::getItemsCount((OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
                           *)in_stack_fffffffffffffda0);
  (*(pCVar2->
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>
    ).
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>_>
    ._vptr_Cloneable[5])(pCVar2,uVar3);
  while( true ) {
    bVar1 = std::
            vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
            ::empty((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
                     *)this_02);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_01 = (InputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_10UL,_void>
               *)(in_RDI + 2);
    collectionSizeLimit = &stack0xfffffffffffffe50;
    this_00 = std::
              vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
              ::begin((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
                       *)in_stack_fffffffffffffd98);
    std::
    vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
    ::end((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
           *)in_stack_fffffffffffffd98);
    SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,unsigned_long,void>
    ::
    appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>>>>,supermap::KeyValueShrinkableStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long,void>::KeyValueShrinkableStorage(supermap::KeyValueShrinkableStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long,void>const&,supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,void,supermap::Key<2ul>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_long)::_lambda(supermap::KeyValue<supermap::Key<2ul>,unsigned_long>const&)_1_,supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,void>
              ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
                *)this_00._M_current,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe50);
    io::
    InputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_10UL,_void>
    ::collect(this_01,(unsigned_long)collectionSizeLimit);
    std::
    vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
    ::operator=((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
                 *)this_02,
                (vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
                 *)this_01);
    std::
    vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
    ::~vector((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
               *)this_02);
  }
  io::OutputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>::flush
            ((OutputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>
              *)0x1e77a7);
  std::
  vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
  ::~vector((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
             *)this_02);
  io::OutputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>::
  ~OutputIterator((OutputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>
                   *)0x1e77c3);
  io::
  InputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_10UL,_void>::
  ~InputIterator((InputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_10UL,_void>
                  *)0x1e77d0);
  return;
}

Assistant:

explicit KeyValueShrinkableStorage(
        const KeyValueShrinkableStorage &oldStorage,
        const KeyIndexStorage &actualIndex,
        const std::string &notSortedStorageFilename,
        const std::string &sortedStorageFilename,
        std::size_t indexBatchSize
    ) : IndexedStorage<KeyValue<Key, Value>, IndexT, void>([]() { return std::make_unique<VoidRegister<KV>>(); }),
        sortedStorage_(sortedStorageFilename,
                       oldStorage.getFileManager(),
                       []() { return std::make_unique<VoidRegister<KV>>(); }),
        notSortedStorage_(notSortedStorageFilename,
                          oldStorage.getFileManager(),
                          []() { return std::make_unique<VoidRegister<KV>>(); }),
        innerRegisterSupplier_(oldStorage.innerRegisterSupplier_) {
        auto indexIterator = actualIndex.getDataIterator();
        io::OutputIterator<KV> keyValueOutputIterator
            = getFileManager()->template getOutputIterator<KV>(
                sortedStorage_.getStorageFilePath(),
                false
            );
        std::vector<KeyIndex> currentBatchIndex = indexIterator.collect(indexBatchSize);
        sortedStorage_.getRegister().reserve(sortedStorage_.getItemsCount());
        while (!currentBatchIndex.empty()) {
            sortedStorage_.appendAll(
                currentBatchIndex.begin(),
                currentBatchIndex.end(),
                [&](const KeyIndex &keyIndex) {
                    return KeyValue{
                        keyIndex.key,
                        oldStorage.get(keyIndex.value).value
                    };
                }
            );
            currentBatchIndex = indexIterator.collect(indexBatchSize);
        }
        keyValueOutputIterator.flush();
    }